

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O1

Var Js::CrossSite::MarshalVar(ScriptContext *scriptContext,Var value,bool fRequestWrapper)

{
  bool bVar1;
  RecyclableObject *aValue;
  Var pvVar2;
  
  if (((value != (Var)0x0) && (bVar1 = VarIs<Js::RecyclableObject>(value), bVar1)) &&
     ((aValue = UnsafeVarTo<Js::RecyclableObject>(value), fRequestWrapper ||
      ((((((aValue->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
       ptr != scriptContext)))) {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_015cd718,MarshalPhase);
    if (bVar1) {
      Output::Print(L"MarshalVar: %p (var sc: %p, request sc: %p, requestWrapper: %d)\n",aValue,
                    (((((aValue->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                    scriptContext.ptr,scriptContext,(ulong)fRequestWrapper);
    }
    bVar1 = JavascriptConversion::IsCallable(aValue);
    if ((!bVar1) ||
       ((int)((((((aValue->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
              scriptContext.ptr)->scriptContextPrivilegeLevel <=
        (int)scriptContext->scriptContextPrivilegeLevel)) {
      pvVar2 = MarshalVarInner(scriptContext,aValue,fRequestWrapper);
      return pvVar2;
    }
    value = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
            super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  return (RecyclableObject *)value;
}

Assistant:

Var CrossSite::MarshalVar(ScriptContext* scriptContext, Var value, bool fRequestWrapper)
    {
        // value might be null from disable implicit call
        if (value == nullptr || Js::TaggedNumber::Is(value))
        {
            return value;
        }
        Js::RecyclableObject* object =  UnsafeVarTo<RecyclableObject>(value);

        if (fRequestWrapper || scriptContext != object->GetScriptContext())
        {
            if (PHASE_TRACE1(Js::Phase::MarshalPhase))
            {
                Output::Print(_u("MarshalVar: %p (var sc: %p, request sc: %p, requestWrapper: %d)\n"), object, object->GetScriptContext(), scriptContext, fRequestWrapper);
            }

            // Do not allow marshaling if a callable object is being marshalled into a high privileged
            // script context.
            if (JavascriptConversion::IsCallable(object))
            {
                ScriptContext* objectScriptContext = object->GetScriptContext();
                if (scriptContext->GetPrivilegeLevel() < objectScriptContext->GetPrivilegeLevel())
                {
                    return scriptContext->GetLibrary()->GetUndefined();
                }
            }
            return MarshalVarInner(scriptContext, object, fRequestWrapper);
        }
        return value;
    }